

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ComputeCompleteInformationValues
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this)

{
  element_type *peVar1;
  pointer pdVar2;
  size_type __new_size;
  long lVar3;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double local_68;
  string local_60;
  vector<double,_std::allocator<double>_> *local_40;
  double local_38;
  
  __new_size = BayesianGameBase::GetNrJointTypes();
  local_40 = &this->_m_completeInformationValues;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->_m_completeInformationValues,__new_size);
  if ((this->_m_completeInformationValues).super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->_m_completeInformationValues).super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      iVar8 = (int)uVar9;
      if (((uint)(iVar8 * -0x3d70a3d7) >> 2 | iVar8 * 0x40000000) < 0x28f5c29) {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,
                   "BnB deadline exceeded (in ComputeCompleteInformationValues())","");
        (**(code **)(*(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>
                               ).super_BGIP_IncrementalSolverInterface + 8))(this,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      lVar3 = BayesianGameBase::GetNrJointActions();
      local_68 = -1.79769313486232e+308;
      if (lVar3 != 0) {
        uVar7 = 1;
        local_68 = -1.79769313486232e+308;
        do {
          peVar1 = (this->_m_bgip).px;
          local_38 = (double)(**(code **)(*(long *)peVar1 + 0x68))(peVar1,uVar9);
          peVar1 = (this->_m_bgip).px;
          dVar10 = (double)(**(code **)(*(long *)peVar1 + 0x80))(peVar1,uVar9,uVar7 - 1);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_68;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = dVar10 * local_38;
          auVar11 = vmaxsd_avx(auVar12,auVar11);
          local_68 = auVar11._0_8_;
          uVar6 = (ulong)uVar7;
          uVar4 = BayesianGameBase::GetNrJointActions();
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar6);
      }
      pdVar2 = (this->_m_completeInformationValues).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar2[uVar9] = local_68;
      uVar9 = (ulong)(iVar8 + 1);
    } while ((long)(this->_m_completeInformationValues).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 != uVar9);
  }
  if (2 < this->_m_verbosity) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BGIP_SolverBranchAndBound Complete information values: ",0x37)
    ;
    PrintTools::SoftPrintVector<double>(&local_60,local_40);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void ComputeCompleteInformationValues()
    {
        _m_completeInformationValues.resize(_m_bgip->GetNrJointTypes());
        for(Index i=0;i!=_m_completeInformationValues.size();++i)
        {
            if(i % 100 == 0)
                this->CheckDeadline("BnB deadline exceeded (in ComputeCompleteInformationValues())");

            double bestValue=-DBL_MAX;
            for(Index ja=0;ja!=_m_bgip->GetNrJointActions();++ja)
            {
                double c=GetContribution(i,ja);
                bestValue=std::max(c,bestValue);
            }
            _m_completeInformationValues[i]=bestValue;
        }
        
        if(_m_verbosity>2)
            std::cout << "BGIP_SolverBranchAndBound Complete information values: "
                      << SoftPrintVector(_m_completeInformationValues)
                      << std::endl;
    }